

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve_op.hpp
# Opt level: O0

void asio::detail::
     resolve_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  scheduler *this;
  char *host;
  addrinfo_type *op;
  anon_class_8_1_8991fb9c *handler_00;
  error_code *arg1;
  long in_RSI;
  long in_RDI;
  fenced_block b;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
  handler;
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_asio::system_executor>
  w;
  ptr p;
  resolve_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13)>
  *o;
  basic_resolver_query<asio::ip::tcp> *in_stack_fffffffffffffe68;
  error_code *in_stack_fffffffffffffe70;
  addrinfo_type **in_stack_fffffffffffffe78;
  addrinfo_type *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  ptr *in_stack_fffffffffffffe90;
  string local_148 [32];
  string local_128 [80];
  undefined1 local_d8 [32];
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  string local_98 [48];
  string local_68 [39];
  handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_asio::system_executor>
  local_41;
  undefined1 *local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_8;
  
  local_40 = (undefined1 *)(in_RSI + 0xa0);
  local_38 = in_RSI;
  local_30 = in_RSI;
  local_28 = in_RSI;
  local_8 = in_RDI;
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13),_asio::system_executor>
  ::handler_work(&local_41,(anon_class_8_1_8991fb9c *)(in_RSI + 0xa0));
  if ((local_8 == 0) || (local_8 == *(long *)(local_28 + 0x98))) {
    arg1 = (error_code *)(local_28 + 0xa0);
    handler_00 = (anon_class_8_1_8991fb9c *)(local_28 + 0xa8);
    ip::basic_resolver_results<asio::ip::tcp>::basic_resolver_results
              ((basic_resolver_results<asio::ip::tcp> *)0x124976);
    binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
    ::binder2((binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
               *)in_stack_fffffffffffffe80,handler_00,arg1,
              (basic_resolver_results<asio::ip::tcp> *)in_stack_fffffffffffffe68);
    ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
              ((basic_resolver_results<asio::ip::tcp> *)0x1249a6);
    local_40 = local_d8;
    if (*(long *)(local_28 + 0xb8) != 0) {
      in_stack_fffffffffffffe68 = *(basic_resolver_query<asio::ip::tcp> **)(local_28 + 0xb8);
      ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_(in_stack_fffffffffffffe68);
      ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_(in_stack_fffffffffffffe68);
      ip::basic_resolver_results<asio::ip::tcp>::create
                ((addrinfo_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      ip::basic_resolver_results<asio::ip::tcp>::operator=
                ((basic_resolver_results<asio::ip::tcp> *)arg1,
                 (basic_resolver_results<asio::ip::tcp> *)in_stack_fffffffffffffe68);
      ip::basic_resolver_results<asio::ip::tcp>::~basic_resolver_results
                ((basic_resolver_results<asio::ip::tcp> *)0x124a48);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_128);
    }
    ptr::reset(in_stack_fffffffffffffe90);
    if (local_8 != 0) {
      gcc_x86_fenced_block::gcc_x86_fenced_block
                ((gcc_x86_fenced_block *)arg1,(half_t)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      handler_work<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::$_0,asio::system_executor>
      ::
      complete<asio::detail::binder2<mau::ProxySession::Initialize(char_const*,unsigned_short,MauProxyConfig_t_const&,MauChannelConfig_t_const&)::__0,std::error_code,asio::ip::basic_resolver_results<asio::ip::tcp>>>
                ((handler_work<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_asio::system_executor>
                  *)arg1,(binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
                          *)in_stack_fffffffffffffe68,(anon_class_8_1_8991fb9c *)0x124b43);
      gcc_x86_fenced_block::~gcc_x86_fenced_block((gcc_x86_fenced_block *)arg1);
    }
    binder2<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
    ::~binder2((binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]mau_MauProxy_cpp:532:13),_std::error_code,_asio::ip::basic_resolver_results<asio::ip::tcp>_>
                *)0x124b7e);
  }
  else {
    ip::basic_resolver_query<asio::ip::tcp>::host_name_abi_cxx11_(in_stack_fffffffffffffe68);
    this = (scheduler *)std::__cxx11::string::c_str();
    ip::basic_resolver_query<asio::ip::tcp>::service_name_abi_cxx11_(in_stack_fffffffffffffe68);
    host = (char *)std::__cxx11::string::c_str();
    op = ip::basic_resolver_query<asio::ip::tcp>::hints
                   ((basic_resolver_query<asio::ip::tcp> *)(local_28 + 0x28));
    socket_ops::background_getaddrinfo
              ((weak_cancel_token_type *)op,host,
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_68);
    scheduler::post_deferred_completion(this,(operation *)op);
    local_30 = 0;
    local_38 = 0;
  }
  handler_work<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]mau/MauProxy.cpp:532:13),_asio::system_executor>
  ::~handler_work(&local_41);
  ptr::~ptr((ptr *)0x124ba9);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the operation object.
    resolve_op* o(static_cast<resolve_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    if (owner && owner != &o->io_context_impl_)
    {
      // The operation is being run on the worker io_context. Time to perform
      // the resolver operation.
    
      // Perform the blocking host resolution operation.
      socket_ops::background_getaddrinfo(o->cancel_token_,
          o->query_.host_name().c_str(), o->query_.service_name().c_str(),
          o->query_.hints(), &o->addrinfo_, o->ec_);

      // Pass operation back to main io_context for completion.
      o->io_context_impl_.post_deferred_completion(o);
      p.v = p.p = 0;
    }
    else
    {
      // The operation has been returned to the main io_context. The completion
      // handler is ready to be delivered.

      ASIO_HANDLER_COMPLETION((*o));

      // Make a copy of the handler so that the memory can be deallocated
      // before the upcall is made. Even if we're not about to make an upcall,
      // a sub-object of the handler may be the true owner of the memory
      // associated with the handler. Consequently, a local copy of the handler
      // is required to ensure that any owning sub-object remains valid until
      // after we have deallocated the memory here.
      detail::binder2<Handler, asio::error_code, results_type>
        handler(o->handler_, o->ec_, results_type());
      p.h = asio::detail::addressof(handler.handler_);
      if (o->addrinfo_)
      {
        handler.arg2_ = results_type::create(o->addrinfo_,
            o->query_.host_name(), o->query_.service_name());
      }
      p.reset();

      if (owner)
      {
        fenced_block b(fenced_block::half);
        ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, "..."));
        w.complete(handler, handler.handler_);
        ASIO_HANDLER_INVOCATION_END;
      }
    }
  }